

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

void m256v_mul(m256v *A,m256v *B,m256v *AB_out)

{
  uint8_t uVar1;
  int *in_RDX;
  long in_RDI;
  uint8_t b;
  uint8_t a;
  int e;
  uint8_t x;
  int j;
  int i;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined5 in_stack_ffffffffffffffd0;
  uint8_t in_stack_ffffffffffffffd5;
  uint8_t in_stack_ffffffffffffffd6;
  uint8_t in_stack_ffffffffffffffd7;
  int c;
  uint in_stack_ffffffffffffffdc;
  int iVar2;
  int iVar3;
  
  for (iVar3 = 0; iVar3 < *in_RDX; iVar3 = iVar3 + 1) {
    for (iVar2 = 0; iVar2 < in_RDX[1]; iVar2 = iVar2 + 1) {
      in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc & 0xffffff;
      for (c = 0; c < *(int *)(in_RDI + 4); c = c + 1) {
        in_stack_ffffffffffffffd7 =
             m256v_get_el((m256v *)CONCAT17(in_stack_ffffffffffffffd7,
                                            CONCAT16(in_stack_ffffffffffffffd6,
                                                     CONCAT15(in_stack_ffffffffffffffd5,
                                                              in_stack_ffffffffffffffd0))),
                          in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
        in_stack_ffffffffffffffd6 =
             m256v_get_el((m256v *)CONCAT17(in_stack_ffffffffffffffd7,
                                            CONCAT16(in_stack_ffffffffffffffd6,
                                                     CONCAT15(in_stack_ffffffffffffffd5,
                                                              in_stack_ffffffffffffffd0))),
                          in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
        in_stack_ffffffffffffffd5 = (uint8_t)(in_stack_ffffffffffffffdc >> 0x18);
        uVar1 = gf256_mul('\0','\0');
        uVar1 = gf256_add(in_stack_ffffffffffffffd5,uVar1);
        in_stack_ffffffffffffffdc = CONCAT13(uVar1,(int3)in_stack_ffffffffffffffdc);
      }
      m256v_set_el((m256v *)CONCAT44(iVar3,iVar2),in_stack_ffffffffffffffdc,c,
                   in_stack_ffffffffffffffd7);
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_mul)(const MV_GEN_TYPE* A, const MV_GEN_TYPE* B, MV_GEN_TYPE* AB_out)
{
	assert(A->n_col == B->n_row);
	assert(A->n_row == AB_out->n_row);
	assert(B->n_col == AB_out->n_col);

	for (int i = 0; i < AB_out->n_row; ++i) {
		for (int j = 0; j < AB_out->n_col; ++j) {
			MV_GEN_ELTYPE x = 0;
			for (int e = 0; e < A->n_col; ++e) {
				const MV_GEN_ELTYPE a = MV_GEN_N(_get_el)(A, i, e);
				const MV_GEN_ELTYPE b = MV_GEN_N(_get_el)(B, e, j);
				x = fadd(x, fmul(a, b));
			}
			MV_GEN_N(_set_el)(AB_out, i, j, x);
		}
	}
}